

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clGetSupportedGLTextureFormatsINTEL
                 (cl_context context,cl_mem_flags flags,cl_mem_object_type image_type,
                 cl_uint num_entries,cl_GLenum *gl_formats,cl_uint *num_texture_formats)

{
  cl_context p_Var1;
  bool bVar2;
  SConfig *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *functionName;
  cl_uint in_ECX;
  cl_mem_object_type in_EDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  cl_context in_RDI;
  cl_GLenum *in_R8;
  cl_uint *in_R9;
  cl_int in_stack_00000064;
  char *in_stack_00000068;
  CLIntercept *in_stack_00000070;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe50;
  CLIntercept *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  CLIntercept *this;
  CEnumNameMap *this_00;
  cl_mem_flags in_stack_fffffffffffffeb0;
  CEnumNameMap *in_stack_fffffffffffffeb8;
  CEnumNameMap *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  cl_int errorCode;
  char *in_stack_fffffffffffffed8;
  CLIntercept *in_stack_fffffffffffffee0;
  string local_118 [7];
  undefined1 in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  CLIntercept *in_stack_ffffffffffffff00;
  time_point in_stack_ffffffffffffff08;
  time_point in_stack_ffffffffffffff10;
  time_point in_stack_ffffffffffffff18;
  time_point in_stack_ffffffffffffff20;
  cl_int local_b4;
  CLIntercept *local_a0;
  string local_88 [32];
  string local_68 [32];
  CEnumNameMap *local_48;
  CLdispatchX *local_40;
  CLIntercept *local_38;
  cl_uint *local_30;
  cl_GLenum *local_28;
  cl_uint local_20;
  cl_mem_object_type local_1c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_18;
  cl_context local_10;
  cl_int local_4;
  
  errorCode = (cl_int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (local_40 = CLIntercept::dispatchX
                           ((CLIntercept *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (cl_context)in_stack_fffffffffffffe58),
     local_40->clGetSupportedGLTextureFormatsINTEL ==
     (_func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_GLenum_ptr_cl_uint_ptr *)
     0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffecc)
    ;
    local_4 = -0x22;
  }
  else {
    local_48 = (CEnumNameMap *)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffe58);
    pSVar3 = CLIntercept::config(local_38);
    p_Var1 = local_10;
    if ((pSVar3->CallLogging & 1U) != 0) {
      this = local_38;
      this_00 = local_48;
      CLIntercept::enumName(local_38);
      CEnumNameMap::name_mem_flags_abi_cxx11_(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      uVar4 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffe50 = local_18;
      in_stack_fffffffffffffec0 = CLIntercept::enumName(local_38);
      CEnumNameMap::name_abi_cxx11_(this_00,(cl_int)((ulong)this >> 0x20));
      uVar5 = std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (this,"clGetSupportedGLTextureFormatsINTEL",(uint64_t)this_00,(cl_kernel)0x0,
                 "context = %p, flags = %s (%llX), image_type = %s (%X)",p_Var1,uVar4,
                 in_stack_fffffffffffffe50,uVar5,local_1c);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_68);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe50);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe50);
    pSVar3 = CLIntercept::config(local_38);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      local_a0 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
    }
    local_b4 = (*local_40->clGetSupportedGLTextureFormatsINTEL)
                         (local_10,(cl_mem_flags)local_18,local_1c,local_20,local_28,local_30);
    pSVar3 = CLIntercept::config(local_38);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(local_38), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      functionName = (char *)std::chrono::_V2::steady_clock::now();
      pSVar3 = CLIntercept::config(local_38);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,(uint64_t)local_48),
         bVar2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff20,"",(allocator *)&stack0xffffffffffffff1f);
        CLIntercept::updateHostTimingStats
                  (local_a0,functionName,(string *)in_stack_ffffffffffffff00,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
        in_stack_ffffffffffffff08.__d.__r = (duration)(duration)functionName;
        in_stack_ffffffffffffff10.__d.__r = (duration)(duration)local_a0;
      }
    }
    pSVar3 = CLIntercept::config(local_38);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_38), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(local_38), (pSVar3->NoErrors & 1U) != 0)) && (local_b4 != 0))
    {
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000070,in_stack_00000068,in_stack_00000064);
      }
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(local_38);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_b4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(local_38);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,errorCode,
                 (cl_event *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (cl_sync_point_khr *)in_stack_fffffffffffffec0);
    }
    pSVar3 = CLIntercept::config(local_38);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"",(allocator *)&stack0xfffffffffffffee7);
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (bool)in_stack_fffffffffffffeef,(uint64_t)in_stack_fffffffffffffee0,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    }
    local_4 = local_b4;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetSupportedGLTextureFormatsINTEL(
    cl_context context,
    cl_mem_flags flags,
    cl_mem_object_type image_type,
    cl_uint num_entries,
    cl_GLenum* gl_formats,
    cl_uint* num_texture_formats)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clGetSupportedGLTextureFormatsINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), image_type = %s (%X)",
                context,
                pIntercept->enumName().name_mem_flags( flags ).c_str(),
                flags,
                pIntercept->enumName().name( image_type ).c_str(),
                image_type );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clGetSupportedGLTextureFormatsINTEL(
                context,
                flags,
                image_type,
                num_entries,
                gl_formats,
                num_texture_formats);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}